

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O0

int Gia_MiniAigSuperPreprocess(Mini_Aig_t *p,Vec_Wec_t *vSuper,int nPis,int fVerbose)

{
  int iVar1;
  Vec_Int_t *p_00;
  uint local_34;
  int local_30;
  int Multi;
  int nIters;
  int i;
  Vec_Int_t *vRes;
  int fVerbose_local;
  int nPis_local;
  Vec_Wec_t *vSuper_local;
  Mini_Aig_t *p_local;
  
  local_34 = 1;
  for (Multi = 0; iVar1 = Vec_WecSize(vSuper), Multi < iVar1; Multi = Multi + 1) {
    p_00 = Vec_WecEntry(vSuper,Multi);
    Vec_IntSort(p_00,0);
    if (fVerbose != 0) {
      printf("\nOutput %d\n",(ulong)(uint)Multi);
      Gia_MiniAigSuperPrintDouble(p_00,nPis);
    }
    local_30 = 1;
    while (iVar1 = Gia_MiniAigSuperMerge(p_00,nPis), iVar1 != 0) {
      if (fVerbose != 0) {
        Gia_MiniAigSuperPrintDouble(p_00,nPis);
      }
      local_30 = local_30 + 1;
    }
    local_34 = Abc_MaxInt(local_34,local_30);
  }
  if (fVerbose != 0) {
    printf("Multi = %d.\n",(ulong)local_34);
  }
  return local_34;
}

Assistant:

int Gia_MiniAigSuperPreprocess( Mini_Aig_t * p, Vec_Wec_t * vSuper, int nPis, int fVerbose )
{
    Vec_Int_t * vRes;
    int i, nIters, Multi = 1;
    Vec_WecForEachLevel( vSuper, vRes, i )
    {
        Vec_IntSort( vRes, 0 );
        if ( fVerbose ) 
            printf( "\nOutput %d\n", i );
        if ( fVerbose )
            Gia_MiniAigSuperPrintDouble( vRes, nPis );
        for ( nIters = 1; Gia_MiniAigSuperMerge(vRes, nPis); nIters++ )
        {
            if ( fVerbose )
                Gia_MiniAigSuperPrintDouble( vRes, nPis );
        }
        Multi = Abc_MaxInt( Multi, nIters );
    }
    if ( fVerbose )
        printf( "Multi = %d.\n", Multi );
    return Multi;
}